

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O2

void set_mi_offsets(CommonModeInfoParams *mi_params,MACROBLOCKD *xd,int mi_row,int mi_col)

{
  int iVar1;
  int iVar2;
  
  iVar1 = mi_params->mi_stride;
  iVar2 = iVar1 * mi_row + mi_col;
  mi_params->mi_grid_base[iVar2] =
       mi_params->mi_alloc +
       ((mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [mi_params->mi_alloc_bsize]) * mi_params->mi_alloc_stride +
       mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [mi_params->mi_alloc_bsize]);
  xd->mi = mi_params->mi_grid_base + iVar2;
  xd->tx_type_map = mi_params->tx_type_map + iVar2;
  xd->tx_type_map_stride = iVar1;
  return;
}

Assistant:

static inline void set_mi_offsets(const CommonModeInfoParams *const mi_params,
                                  MACROBLOCKD *const xd, int mi_row,
                                  int mi_col) {
  // 'mi_grid_base' should point to appropriate memory in 'mi'.
  const int mi_grid_idx = get_mi_grid_idx(mi_params, mi_row, mi_col);
  const int mi_alloc_idx = get_alloc_mi_idx(mi_params, mi_row, mi_col);
  mi_params->mi_grid_base[mi_grid_idx] = &mi_params->mi_alloc[mi_alloc_idx];
  // 'xd->mi' should point to an offset in 'mi_grid_base';
  xd->mi = mi_params->mi_grid_base + mi_grid_idx;
  // 'xd->tx_type_map' should point to an offset in 'mi_params->tx_type_map'.
  xd->tx_type_map = mi_params->tx_type_map + mi_grid_idx;
  xd->tx_type_map_stride = mi_params->mi_stride;
}